

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

string * __thiscall
t_java_generator::get_java_type_string_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_type *type)

{
  uint uVar1;
  t_base tVar2;
  int iVar3;
  t_type *type_00;
  undefined4 extraout_var;
  runtime_error *prVar4;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  t_typedef *local_20;
  t_type *type_local;
  t_java_generator *this_local;
  
  local_20 = (t_typedef *)type;
  type_local = (t_type *)this;
  this_local = (t_java_generator *)__return_storage_ptr__;
  uVar1 = (*(type->super_t_doc)._vptr_t_doc[0xe])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[0x10])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[0xf])();
      if ((uVar1 & 1) == 0) {
        uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[0xb])();
        if (((uVar1 & 1) == 0) &&
           (uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar1 & 1) == 0)) {
          uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[10])();
          if ((uVar1 & 1) == 0) {
            uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[9])();
            if ((uVar1 & 1) == 0) {
              uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[5])();
              if ((uVar1 & 1) == 0) {
                prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
                std::operator+(&local_c8,"Unknown thrift type \"",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(extraout_var_00,iVar3));
                std::operator+(&local_a8,&local_c8,
                               "\" passed to t_java_generator::get_java_type_string!");
                std::runtime_error::runtime_error(prVar4,(string *)&local_a8);
                __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              tVar2 = t_base_type::get_base((t_base_type *)local_20);
              switch(tVar2) {
              case TYPE_VOID:
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.VOID",
                           &local_39);
                std::allocator<char>::~allocator((allocator<char> *)&local_39);
                break;
              case TYPE_STRING:
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,
                           "org.apache.thrift.protocol.TType.STRING",&local_3a);
                std::allocator<char>::~allocator((allocator<char> *)&local_3a);
                break;
              case TYPE_BOOL:
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.BOOL",
                           &local_3b);
                std::allocator<char>::~allocator((allocator<char> *)&local_3b);
                break;
              case TYPE_I8:
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.BYTE",
                           &local_3c);
                std::allocator<char>::~allocator((allocator<char> *)&local_3c);
                break;
              case TYPE_I16:
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.I16",
                           &local_3d);
                std::allocator<char>::~allocator((allocator<char> *)&local_3d);
                break;
              case TYPE_I32:
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.I32",
                           &local_3e);
                std::allocator<char>::~allocator((allocator<char> *)&local_3e);
                break;
              case TYPE_I64:
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.I64",
                           &local_3f);
                std::allocator<char>::~allocator((allocator<char> *)&local_3f);
                break;
              case TYPE_DOUBLE:
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,
                           "org.apache.thrift.protocol.TType.DOUBLE",&local_40);
                std::allocator<char>::~allocator((allocator<char> *)&local_40);
                break;
              default:
                local_81 = 1;
                prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
                std::operator+(&local_80,"Unknown thrift type \"",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(extraout_var,iVar3));
                std::operator+(&local_60,&local_80,
                               "\" passed to t_java_generator::get_java_type_string!");
                std::runtime_error::runtime_error(prVar4,(string *)&local_60);
                local_81 = 0;
                __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
            }
            else {
              type_00 = t_typedef::get_type(local_20);
              get_java_type_string_abi_cxx11_(__return_storage_ptr__,this,type_00);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.ENUM",
                       &local_38);
            std::allocator<char>::~allocator((allocator<char> *)&local_38);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.STRUCT",
                     &local_37);
          std::allocator<char>::~allocator((allocator<char> *)&local_37);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.SET",&local_36
                  );
        std::allocator<char>::~allocator((allocator<char> *)&local_36);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.MAP",local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.LIST",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_java_generator::get_java_type_string(t_type* type) {
  if (type->is_list()) {
    return "org.apache.thrift.protocol.TType.LIST";
  } else if (type->is_map()) {
    return "org.apache.thrift.protocol.TType.MAP";
  } else if (type->is_set()) {
    return "org.apache.thrift.protocol.TType.SET";
  } else if (type->is_struct() || type->is_xception()) {
    return "org.apache.thrift.protocol.TType.STRUCT";
  } else if (type->is_enum()) {
    return "org.apache.thrift.protocol.TType.ENUM";
  } else if (type->is_typedef()) {
    return get_java_type_string(((t_typedef*)type)->get_type());
  } else if (type->is_base_type()) {
    switch (((t_base_type*)type)->get_base()) {
    case t_base_type::TYPE_VOID:
      return "org.apache.thrift.protocol.TType.VOID";
      break;
    case t_base_type::TYPE_STRING:
      return "org.apache.thrift.protocol.TType.STRING";
      break;
    case t_base_type::TYPE_BOOL:
      return "org.apache.thrift.protocol.TType.BOOL";
      break;
    case t_base_type::TYPE_I8:
      return "org.apache.thrift.protocol.TType.BYTE";
      break;
    case t_base_type::TYPE_I16:
      return "org.apache.thrift.protocol.TType.I16";
      break;
    case t_base_type::TYPE_I32:
      return "org.apache.thrift.protocol.TType.I32";
      break;
    case t_base_type::TYPE_I64:
      return "org.apache.thrift.protocol.TType.I64";
      break;
    case t_base_type::TYPE_DOUBLE:
      return "org.apache.thrift.protocol.TType.DOUBLE";
      break;
    default:
      throw std::runtime_error("Unknown thrift type \"" + type->get_name()
                               + "\" passed to t_java_generator::get_java_type_string!");
      return "Unknown thrift type \"" + type->get_name()
             + "\" passed to t_java_generator::get_java_type_string!";
      break; // This should never happen!
    }
  } else {
    throw std::runtime_error("Unknown thrift type \"" + type->get_name()
                             + "\" passed to t_java_generator::get_java_type_string!");
    // This should never happen!
  }
}